

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::QControlledGate2
          (QControlledGate2<std::complex<float>_> *this,int control,int controlState)

{
  bool local_21;
  int controlState_local;
  int control_local;
  QControlledGate2<std::complex<float>_> *this_local;
  
  QGate2<std::complex<float>_>::QGate2(&this->super_QGate2<std::complex<float>_>);
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00179ea8;
  this->control_ = control;
  this->controlState_ = controlState;
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x22,
                  "qclab::qgates::QControlledGate2<std::complex<float>>::QControlledGate2(const int, const int) [T = std::complex<float>]"
                 );
  }
  local_21 = 1 < (uint)controlState;
  if (local_21) {
    __assert_fail("( controlState == 0 ) || ( controlState == 1 )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x23,
                  "qclab::qgates::QControlledGate2<std::complex<float>>::QControlledGate2(const int, const int) [T = std::complex<float>]"
                 );
  }
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }